

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_options_common<char>::~basic_json_options_common
          (basic_json_options_common<char> *this)

{
  basic_json_options_common<char> *in_RDI;
  
  ~basic_json_options_common(in_RDI);
  operator_delete(in_RDI,0xd8);
  return;
}

Assistant:

virtual ~basic_json_options_common() = default;